

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_extern_t::wasm_extern_t(wasm_extern_t *this,RefPtr<wabt::interp::Extern> *ptr)

{
  RefPtr<wabt::interp::Object> local_30;
  RefPtr<wabt::interp::Extern> *local_18;
  RefPtr<wabt::interp::Extern> *ptr_local;
  wasm_extern_t *this_local;
  
  local_18 = ptr;
  ptr_local = (RefPtr<wabt::interp::Extern> *)this;
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Extern>(&local_30,ptr);
  wasm_ref_t::wasm_ref_t(&this->super_wasm_ref_t,&local_30);
  wabt::interp::RefPtr<wabt::interp::Object>::~RefPtr(&local_30);
  return;
}

Assistant:

wasm_extern_t(RefPtr<Extern> ptr) : wasm_ref_t(ptr) {}